

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# autolink.cc
# Opt level: O0

base_learner * autolink_setup(options_i *options,vw *all)

{
  byte bVar1;
  uint32_t uVar2;
  pointer paVar3;
  single_learner *base;
  long *in_RDI;
  learner<autolink,_example> *ret;
  option_group_definition new_options;
  free_ptr<autolink> data;
  typed_option<unsigned_int> *in_stack_fffffffffffffd48;
  vw *in_stack_fffffffffffffd50;
  string *in_stack_fffffffffffffd58;
  base_learner *in_stack_fffffffffffffd60;
  typed_option<unsigned_int> *op;
  option_group_definition *this;
  allocator local_249;
  string local_248 [39];
  allocator local_221;
  string local_220 [39];
  undefined1 local_1f9 [33];
  typed_option<unsigned_int> local_1d8;
  learner<char,_char> *in_stack_ffffffffffffff10;
  undefined1 local_81 [33];
  undefined1 local_60 [80];
  long *local_10;
  base_learner *local_8;
  
  local_10 = in_RDI;
  scoped_calloc_or_throw<autolink>();
  this = (option_group_definition *)local_81;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)(local_81 + 1),"Autolink",(allocator *)this);
  VW::config::option_group_definition::option_group_definition
            ((option_group_definition *)in_stack_fffffffffffffd50,
             (string *)in_stack_fffffffffffffd48);
  std::__cxx11::string::~string((string *)(local_81 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_81);
  op = (typed_option<unsigned_int> *)local_1f9;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)(local_1f9 + 1),"autolink",(allocator *)op);
  std::unique_ptr<autolink,_void_(*)(void_*)>::operator->
            ((unique_ptr<autolink,_void_(*)(void_*)> *)0x3a6e7c);
  VW::config::make_option<unsigned_int>(in_stack_fffffffffffffd58,(uint *)in_stack_fffffffffffffd50)
  ;
  VW::config::typed_option<unsigned_int>::keep(&local_1d8,true);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_220,"create link function with polynomial d",&local_221);
  VW::config::typed_option<unsigned_int>::help
            ((typed_option<unsigned_int> *)in_stack_fffffffffffffd50,
             (string *)in_stack_fffffffffffffd48);
  VW::config::typed_option<unsigned_int>::typed_option
            ((typed_option<unsigned_int> *)in_stack_fffffffffffffd50,in_stack_fffffffffffffd48);
  VW::config::option_group_definition::add<unsigned_int>(this,op);
  VW::config::typed_option<unsigned_int>::~typed_option
            ((typed_option<unsigned_int> *)in_stack_fffffffffffffd50);
  std::__cxx11::string::~string(local_220);
  std::allocator<char>::~allocator((allocator<char> *)&local_221);
  VW::config::typed_option<unsigned_int>::~typed_option
            ((typed_option<unsigned_int> *)in_stack_fffffffffffffd50);
  std::__cxx11::string::~string((string *)(local_1f9 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_1f9);
  (**(code **)*local_10)(local_10,local_60);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_248,"autolink",&local_249);
  bVar1 = (**(code **)(*local_10 + 8))(local_10,local_248);
  std::__cxx11::string::~string(local_248);
  std::allocator<char>::~allocator((allocator<char> *)&local_249);
  if (((bVar1 ^ 0xff) & 1) == 0) {
    uVar2 = parameters::stride_shift((parameters *)in_stack_fffffffffffffd48);
    paVar3 = std::unique_ptr<autolink,_void_(*)(void_*)>::operator->
                       ((unique_ptr<autolink,_void_(*)(void_*)> *)0x3a71c0);
    paVar3->stride_shift = uVar2;
    in_stack_fffffffffffffd60 =
         setup_base((options_i *)in_stack_fffffffffffffd58,in_stack_fffffffffffffd50);
    base = LEARNER::as_singleline<char,char>(in_stack_ffffffffffffff10);
    in_stack_fffffffffffffd50 =
         (vw *)LEARNER::init_learner<autolink,example,LEARNER::learner<char,example>>
                         ((free_ptr<autolink> *)in_stack_fffffffffffffd60,base,
                          (_func_void_autolink_ptr_learner<char,_example>_ptr_example_ptr *)
                          in_stack_fffffffffffffd50,
                          (_func_void_autolink_ptr_learner<char,_example>_ptr_example_ptr *)
                          in_stack_fffffffffffffd48);
    local_8 = LEARNER::make_base<autolink,example>
                        ((learner<autolink,_example> *)in_stack_fffffffffffffd50);
  }
  else {
    local_8 = (base_learner *)0x0;
  }
  VW::config::option_group_definition::~option_group_definition
            ((option_group_definition *)in_stack_fffffffffffffd50);
  std::unique_ptr<autolink,_void_(*)(void_*)>::~unique_ptr
            ((unique_ptr<autolink,_void_(*)(void_*)> *)in_stack_fffffffffffffd60);
  return local_8;
}

Assistant:

LEARNER::base_learner* autolink_setup(options_i& options, vw& all)
{
  free_ptr<autolink> data = scoped_calloc_or_throw<autolink>();
  option_group_definition new_options("Autolink");
  new_options.add(make_option("autolink", data->d).keep().help("create link function with polynomial d"));
  options.add_and_parse(new_options);

  if (!options.was_supplied("autolink"))
    return nullptr;

  data->stride_shift = all.weights.stride_shift();

  LEARNER::learner<autolink, example>& ret =
      init_learner(data, as_singleline(setup_base(options, all)), predict_or_learn<true>, predict_or_learn<false>);

  return make_base(ret);
}